

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  byte bVar1;
  Expr *p_00;
  int iVar2;
  ExprList *pEVar3;
  Expr *pEVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  Expr *local_38;
  
  if (p != (ExprList *)0x0) {
    pEVar3 = (ExprList *)sqlite3DbMallocRawNN(db,(long)p->nExpr << 5 | 8);
    iVar7 = 0;
    if (pEVar3 != (ExprList *)0x0) {
      iVar2 = p->nExpr;
      pEVar3->nExpr = iVar2;
      pEVar3->nAlloc = iVar2;
      lVar6 = 8;
      local_38 = (Expr *)0x0;
      for (; iVar7 < iVar2; iVar7 = iVar7 + 1) {
        p_00 = *(Expr **)((long)p->a + lVar6 + -8);
        pEVar4 = sqlite3ExprDup(db,p_00,flags);
        *(Expr **)((long)pEVar3->a + lVar6 + -8) = pEVar4;
        if ((p_00 != (Expr *)0x0) && (pEVar4 != (Expr *)0x0 && p_00->op == 0x9f)) {
          if (pEVar4->iColumn == 0) {
            local_38 = pEVar4->pRight;
          }
          pEVar4->pLeft = local_38;
        }
        pcVar5 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].pExpr + lVar6));
        *(char **)((long)&pEVar3->a[0].pExpr + lVar6) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].zName + lVar6));
        *(char **)((long)&pEVar3->a[0].zName + lVar6) = pcVar5;
        *(undefined1 *)((long)&pEVar3->a[0].zSpan + lVar6) =
             *(undefined1 *)((long)&p->a[0].zSpan + lVar6);
        bVar1 = *(byte *)((long)&pEVar3->a[0].zSpan + lVar6 + 1);
        *(byte *)((long)&pEVar3->a[0].zSpan + lVar6 + 1) = bVar1 & 0xfe;
        *(byte *)((long)&pEVar3->a[0].zSpan + lVar6 + 1) =
             bVar1 & 0xfc | *(byte *)((long)&p->a[0].zSpan + lVar6 + 1) & 2;
        *(undefined4 *)((long)&pEVar3->a[0].zSpan + lVar6 + 4) =
             *(undefined4 *)((long)&p->a[0].zSpan + lVar6 + 4);
        iVar2 = p->nExpr;
        lVar6 = lVar6 + 0x20;
      }
      return pEVar3;
    }
  }
  return (ExprList *)0x0;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem, *pOldItem;
  int i;
  Expr *pPriorSelectCol = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, 
             sizeof(*pNew)+sizeof(pNew->a[0])*(p->nExpr-1) );
  if( pNew==0 ) return 0;
  pNew->nAlloc = pNew->nExpr = p->nExpr;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr 
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0 
    ){
      assert( pNewExpr->iColumn==0 || i>0 );
      if( pNewExpr->iColumn==0 ){
        assert( pOldExpr->pLeft==pOldExpr->pRight );
        pPriorSelectCol = pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        assert( i>0 );
        assert( pItem[-1].pExpr!=0 );
        assert( pNewExpr->iColumn==pItem[-1].pExpr->iColumn+1 );
        assert( pPriorSelectCol==pItem[-1].pExpr->pLeft );
        pNewExpr->pLeft = pPriorSelectCol;
      }
    }
    pItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pItem->zSpan = sqlite3DbStrDup(db, pOldItem->zSpan);
    pItem->sortOrder = pOldItem->sortOrder;
    pItem->done = 0;
    pItem->bSpanIsTab = pOldItem->bSpanIsTab;
    pItem->u = pOldItem->u;
  }
  return pNew;
}